

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recompose.hpp
# Opt level: O1

void __thiscall
MGARD::Recomposer<float>::recompose_level_1D
          (Recomposer<float> *this,float *data_pos,size_t n,float h,bool nodal_row)

{
  size_t n_nodal;
  ostream *poVar1;
  float *nodal_buffer;
  uint uVar2;
  undefined7 in_register_00000009;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  ulong n_coeff;
  float *coeff;
  ulong uVar6;
  float *pfVar7;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  uVar6 = n >> 1;
  n_nodal = uVar6 + 1;
  n_coeff = n - n_nodal;
  memcpy(this->data_buffer,data_pos,n * 4);
  nodal_buffer = this->data_buffer;
  pfVar7 = this->load_v_buffer;
  if ((int)CONCAT71(in_register_00000009,nodal_row) == 0) {
    compute_load_vector_coeff_row<float>
              (pfVar7,n_nodal,n_coeff,h,nodal_buffer,nodal_buffer + uVar6 + 1);
  }
  else {
    *pfVar7 = nodal_buffer[uVar6 + 1] * 0.5;
    if (1 < n_coeff) {
      lVar5 = 0;
      do {
        pfVar7[lVar5 + 1] =
             (nodal_buffer[uVar6 + lVar5 + 1] + nodal_buffer[uVar6 + lVar5 + 2]) * 0.5;
        lVar5 = lVar5 + 1;
      } while ((n - uVar6) + -2 != lVar5);
    }
    pfVar7[n_coeff] = nodal_buffer[n - 1] * 0.5;
    if (n_coeff + 1 == uVar6) {
      pfVar7[n_coeff + 1] = 0.0;
    }
  }
  compute_correction<float>(this->correction_buffer,n_nodal,h,this->load_v_buffer);
  pfVar7 = this->correction_buffer;
  sVar3 = 0;
  do {
    nodal_buffer[sVar3] = nodal_buffer[sVar3] - pfVar7[sVar3];
    sVar3 = sVar3 + 1;
  } while (n_nodal != sVar3);
  if (n != n_nodal) {
    lVar5 = 1;
    do {
      nodal_buffer[uVar6 + lVar5] =
           (nodal_buffer[lVar5 + -1] + nodal_buffer[lVar5]) * 0.5 + nodal_buffer[uVar6 + lVar5];
      lVar5 = lVar5 + 1;
    } while (n - uVar6 != lVar5);
  }
  if (0 < (int)n_coeff) {
    uVar4 = n_coeff & 0xffffffff;
    pfVar7 = nodal_buffer;
    do {
      nodal_buffer = pfVar7 + 1;
      *data_pos = *pfVar7;
      data_pos[1] = pfVar7[uVar6 + 1];
      data_pos = data_pos + 2;
      uVar2 = (int)uVar4 - 1;
      uVar4 = (ulong)uVar2;
      pfVar7 = nodal_buffer;
    } while (uVar2 != 0);
  }
  *data_pos = *nodal_buffer;
  if ((int)n_coeff + 2 == (int)n_nodal) {
    data_pos[1] = (*nodal_buffer + nodal_buffer[1]) * 0.5;
  }
  return;
}

Assistant:

void recompose_level_1D(T * data_pos, size_t n, T h, bool nodal_row=true){
		cerr << n << endl;
		size_t n_nodal = (n >> 1) + 1;
		size_t n_coeff = n - n_nodal;
		memcpy(data_buffer, data_pos, n*sizeof(T));
		T * nodal_buffer = data_buffer;
		T * coeff_buffer = data_buffer + n_nodal;
		if(nodal_row) compute_load_vector_nodal_row(load_v_buffer, n_nodal, n_coeff, h, coeff_buffer);
        else compute_load_vector_coeff_row(load_v_buffer, n_nodal, n_coeff, h, nodal_buffer, coeff_buffer);
		compute_correction(correction_buffer, n_nodal, h, load_v_buffer);
		subtract_correction(n_nodal, nodal_buffer);
		recover_from_interpolant_difference_1D(n_coeff, nodal_buffer, coeff_buffer);
		data_reverse_reorder_1D(data_pos, n_nodal, n_coeff, nodal_buffer, coeff_buffer);
	}